

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

bool ApprovalTests::TestName::registerRootDirectoryFromMainFile(string *file)

{
  ostream *poVar1;
  runtime_error *this;
  string adjustedPath;
  string local_30;
  
  poVar1 = ::std::operator<<((ostream *)&::std::cout,
                             "TestName::registerRootDirectoryFromMainFile from __FILE__ ");
  poVar1 = ::std::operator<<(poVar1,(string *)file);
  ::std::operator<<(poVar1,'\n');
  if (file->_M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&adjustedPath,(string *)file);
    poVar1 = ::std::operator<<((ostream *)&::std::cout,
                               "TestName::registerRootDirectoryFromMainFile found parent  ");
    poVar1 = ::std::operator<<(poVar1,(string *)&adjustedPath);
    ::std::operator<<(poVar1,'\n');
    FileUtils::getDirectory(&local_30,&adjustedPath);
    rootDirectoryStorage_abi_cxx11_();
    ::std::__cxx11::string::operator=
              ((string *)&rootDirectoryStorage[abi:cxx11]()::rootDirectory_abi_cxx11_,
               (string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
    poVar1 = ::std::operator<<((ostream *)&::std::cout,
                               "TestName::registerRootDirectoryFromMainFile result        ");
    rootDirectoryStorage_abi_cxx11_();
    poVar1 = ::std::operator<<(poVar1,(string *)
                                      &rootDirectoryStorage[abi:cxx11]()::rootDirectory_abi_cxx11_);
    ::std::operator<<(poVar1,'\n');
    ::std::__cxx11::string::~string((string *)&adjustedPath);
    return true;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"Cannot register an empty path as root directory");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool TestName::registerRootDirectoryFromMainFile(const std::string& file)
    {
        std::cout << "TestName::registerRootDirectoryFromMainFile from __FILE__ " << file
                  << '\n';

        if (file.empty())
        {
            throw std::runtime_error("Cannot register an empty path as root directory");
        }

        std::string adjustedPath = file;
        std::cout << "TestName::registerRootDirectoryFromMainFile found parent  "
                  << adjustedPath << '\n';

        rootDirectoryStorage() = FileUtils::getDirectory(adjustedPath);
        std::cout << "TestName::registerRootDirectoryFromMainFile result        "
                  << rootDirectoryStorage() << '\n';

        return true;
    }